

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::Fixed32Cases_ReadLittleEndian32FromArray_Test::
Fixed32Cases_ReadLittleEndian32FromArray_Test(Fixed32Cases_ReadLittleEndian32FromArray_Test *this)

{
  Fixed32Cases_ReadLittleEndian32FromArray_Test *this_local;
  
  Fixed32Cases::Fixed32Cases(&this->super_Fixed32Cases);
  (this->super_Fixed32Cases).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)&PTR__Fixed32Cases_ReadLittleEndian32FromArray_Test_02a15f28;
  (this->super_Fixed32Cases).
  super_WithParamInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>.
  _vptr_WithParamInterface = (_func_int **)&DAT_02a15f68;
  return;
}

Assistant:

TEST_P(Fixed32Cases, ReadLittleEndian32FromArray) {
  Fixed32Case kFixed32Cases_case = GetParam();
  memcpy(buffer_, kFixed32Cases_case.bytes, sizeof(kFixed32Cases_case.bytes));

  uint32_t value;
  const uint8_t* end =
      CodedInputStream::ReadLittleEndian32FromArray(buffer_, &value);
  EXPECT_EQ(kFixed32Cases_case.value, value);
  EXPECT_TRUE(end == buffer_ + sizeof(value));
}